

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar2 = (tree->dl).dad;
  uVar10 = (uint)uVar2;
  uVar5 = 7;
  if (uVar2 == 0) {
    uVar5 = 0x8a;
  }
  iVar7 = (uVar2 != 0) + 3;
  lVar11 = 0;
  uVar12 = 0xffffffff;
  do {
    uVar15 = 0;
    do {
      uVar9 = uVar10;
      uVar14 = uVar15;
      if ((long)max_code < (long)(lVar11 + uVar14)) {
        return;
      }
      uVar2 = tree[lVar11 + uVar14 + 1].dl.dad;
      uVar10 = (uint)uVar2;
      uVar15 = uVar14 + 1;
    } while (((int)uVar15 < (int)uVar5) && (uVar9 == uVar10));
    uVar5 = (uint)uVar14;
    if ((int)uVar15 < iVar7) {
      iVar7 = s->bi_valid;
      uVar5 = ~uVar5;
      do {
        uVar3 = s->bl_tree[uVar9].dl.dad;
        uVar4 = s->bl_tree[uVar9].fc.freq;
        uVar8 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar8;
        if ((int)(0x10 - (uint)uVar3) < iVar7) {
          uVar12 = s->pending;
          s->pending = uVar12 + 1;
          s->pending_buf[uVar12] = (Bytef)uVar8;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar12 = s->pending;
          s->pending = uVar12 + 1;
          s->pending_buf[uVar12] = BVar1;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
        }
        else {
          iVar7 = iVar7 + (uint)uVar3;
        }
        s->bi_valid = iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0);
    }
    else {
      iVar7 = s->bi_valid;
      bVar6 = (byte)iVar7;
      if (uVar9 == 0) {
        if (uVar5 < 10) {
          uVar3 = s->bl_tree[0x11].dl.dad;
          uVar4 = s->bl_tree[0x11].fc.freq;
          uVar12 = (uint)s->bi_buf | (uint)uVar4 << (bVar6 & 0x1f);
          if ((int)(0x10 - (uint)uVar3) < iVar7) {
            s->bi_buf = (ush)uVar12;
            uVar13 = s->pending;
            s->pending = uVar13 + 1;
            s->pending_buf[uVar13] = (Bytef)uVar12;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar12 = s->pending;
            s->pending = uVar12 + 1;
            s->pending_buf[uVar12] = BVar1;
            iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
            uVar12 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
          }
          else {
            iVar7 = iVar7 + (uint)uVar3;
          }
          s->bi_valid = iVar7;
          if (iVar7 < 0xe) {
            s->bi_buf = (ushort)uVar12 | (ushort)(uVar5 + 0xfffe << ((byte)iVar7 & 0x1f));
            iVar7 = iVar7 + 3;
          }
          else {
            uVar12 = uVar12 | uVar5 - 2 << ((byte)iVar7 & 0x1f);
            s->bi_buf = (ush)uVar12;
            uVar13 = s->pending;
            s->pending = uVar13 + 1;
            s->pending_buf[uVar13] = (Bytef)uVar12;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar12 = s->pending;
            s->pending = uVar12 + 1;
            s->pending_buf[uVar12] = BVar1;
            s->bi_buf = (ush)((uVar5 - 2 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar7 = s->bi_valid + -0xd;
          }
        }
        else {
          uVar3 = s->bl_tree[0x12].dl.dad;
          uVar4 = s->bl_tree[0x12].fc.freq;
          uVar12 = (uint)s->bi_buf | (uint)uVar4 << (bVar6 & 0x1f);
          if ((int)(0x10 - (uint)uVar3) < iVar7) {
            s->bi_buf = (ush)uVar12;
            uVar13 = s->pending;
            s->pending = uVar13 + 1;
            s->pending_buf[uVar13] = (Bytef)uVar12;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar12 = s->pending;
            s->pending = uVar12 + 1;
            s->pending_buf[uVar12] = BVar1;
            iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
            uVar12 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
          }
          else {
            iVar7 = iVar7 + (uint)uVar3;
          }
          s->bi_valid = iVar7;
          if (iVar7 < 10) {
            s->bi_buf = (ushort)uVar12 | (ushort)(uVar5 + 0xfff6 << ((byte)iVar7 & 0x1f));
            iVar7 = iVar7 + 7;
          }
          else {
            uVar12 = uVar12 | uVar5 - 10 << ((byte)iVar7 & 0x1f);
            s->bi_buf = (ush)uVar12;
            uVar13 = s->pending;
            s->pending = uVar13 + 1;
            s->pending_buf[uVar13] = (Bytef)uVar12;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar12 = s->pending;
            s->pending = uVar12 + 1;
            s->pending_buf[uVar12] = BVar1;
            s->bi_buf = (ush)((uVar5 - 10 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar7 = s->bi_valid + -9;
          }
        }
      }
      else {
        if (uVar9 == uVar12) {
          uVar14 = uVar15 & 0xffffffff;
        }
        else {
          uVar3 = s->bl_tree[uVar9].dl.dad;
          uVar4 = s->bl_tree[uVar9].fc.freq;
          uVar8 = uVar4 << (bVar6 & 0x1f) | s->bi_buf;
          s->bi_buf = uVar8;
          if ((int)(0x10 - (uint)uVar3) < iVar7) {
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar8;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
            iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
          }
          else {
            iVar7 = iVar7 + (uint)uVar3;
          }
          s->bi_valid = iVar7;
        }
        uVar3 = s->bl_tree[0x10].dl.dad;
        uVar4 = s->bl_tree[0x10].fc.freq;
        uVar8 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
        if ((int)(0x10 - (uint)uVar3) < iVar7) {
          s->bi_buf = uVar8;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar8;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar1;
          uVar8 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
        }
        else {
          iVar7 = iVar7 + (uint)uVar3;
        }
        s->bi_valid = iVar7;
        if (iVar7 < 0xf) {
          s->bi_buf = uVar8 | (ushort)((int)uVar14 + 0xfffd << ((byte)iVar7 & 0x1f));
          iVar7 = iVar7 + 2;
        }
        else {
          uVar13 = (int)uVar14 - 3;
          uVar12 = (uint)uVar8 | uVar13 << ((byte)iVar7 & 0x1f);
          s->bi_buf = (ush)uVar12;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar12;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar1;
          s->bi_buf = (ush)((uVar13 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
          iVar7 = s->bi_valid + -0xe;
        }
      }
      s->bi_valid = iVar7;
    }
    lVar11 = lVar11 + uVar15;
    iVar7 = 4 - (uint)(uVar9 == uVar10);
    uVar5 = uVar9 == uVar10 ^ 7;
    uVar12 = uVar9;
    if (uVar2 == 0) {
      iVar7 = 3;
      uVar5 = 0x8a;
    }
  } while( true );
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}